

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_typedef.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
  set;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  char local_44 [4];
  _Hashtable<distance,_distance,_std::allocator<distance>,_std::__detail::_Identity,_std::equal_to<distance>,_std::hash<distance>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_40;
  
  local_44[0] = '\a';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  std::
  _Hashtable<distance,distance,std::allocator<distance>,std::__detail::_Identity,std::equal_to<distance>,std::hash<distance>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<distance_const*>
            ((_Hashtable<distance,distance,std::allocator<distance>,std::__detail::_Identity,std::equal_to<distance>,std::hash<distance>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_40,local_44,&local_40,0,&local_45,&local_46,&local_47);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," distance",9);
  local_44[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_44,1);
  std::
  _Hashtable<distance,_distance,_std::allocator<distance>,_std::__detail::_Identity,_std::equal_to<distance>,_std::hash<distance>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_40);
  return 0;
}

Assistant:

int main()
{
    distance d(4);
    //    int      val = d; // error
    //    d += 3;           // error
    d += distance(3); // works

    std::unordered_set<distance> set{d};

    std::cout << *set.find(d) << '\n';
}